

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O3

CAmount wallet::GetCachableAmount
                  (CWallet *wallet,CWalletTx *wtx,AmountType type,isminefilter *filter)

{
  uint uVar1;
  long lVar2;
  CTransaction *tx;
  CAmount CVar3;
  ulong uVar4;
  CachableAmount *pCVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = wtx->m_amounts + type;
  uVar1 = *filter;
  uVar4 = (ulong)uVar1;
  if (((pCVar5->m_cached).super__Base_bitset<1UL>._M_w >> (uVar4 & 0x3f) & 1) == 0) {
    tx = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (type == DEBIT) {
      CVar3 = CWallet::GetDebit(wallet,tx,filter);
    }
    else {
      CVar3 = TxGetCredit(wallet,tx,filter);
    }
    if (7 < uVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar4,8);
      }
      goto LAB_00b6ee09;
    }
    (pCVar5->m_cached).super__Base_bitset<1UL>._M_w =
         (pCVar5->m_cached).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar1 & 0x3f);
    wtx->m_amounts[type].m_value[uVar4] = CVar3;
    wtx->m_is_cache_empty = false;
    uVar4 = (ulong)*filter;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return wtx->m_amounts[type].m_value[uVar4];
  }
LAB_00b6ee09:
  __stack_chk_fail();
}

Assistant:

static CAmount GetCachableAmount(const CWallet& wallet, const CWalletTx& wtx, CWalletTx::AmountType type, const isminefilter& filter)
{
    auto& amount = wtx.m_amounts[type];
    if (!amount.m_cached[filter]) {
        amount.Set(filter, type == CWalletTx::DEBIT ? wallet.GetDebit(*wtx.tx, filter) : TxGetCredit(wallet, *wtx.tx, filter));
        wtx.m_is_cache_empty = false;
    }
    return amount.m_value[filter];
}